

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveDisplayer.cpp
# Opt level: O0

GLfloat * __thiscall
PrimitiveDisplayer::getRotatedVertices(PrimitiveDisplayer *this,GLfloat blockSize,float angle)

{
  GLfloat *pGVar1;
  Vec2d *pVVar2;
  float fVar3;
  Vec2d *rotatedCoord;
  int i;
  GLfloat *vertices;
  float angle_local;
  GLfloat blockSize_local;
  PrimitiveDisplayer *this_local;
  
  pGVar1 = (GLfloat *)operator_new__(0x20);
  for (rotatedCoord._4_4_ = 0; rotatedCoord._4_4_ < 8; rotatedCoord._4_4_ = rotatedCoord._4_4_ + 2)
  {
    pVVar2 = Vec2d::getRotation(this->verticesVec[rotatedCoord._4_4_ / 2],Vec2d::ORIGIN,angle);
    pVVar2 = Vec2d::withScale(pVVar2,blockSize);
    fVar3 = Vec2d::getX(pVVar2);
    pGVar1[rotatedCoord._4_4_] = fVar3;
    fVar3 = Vec2d::getY(pVVar2);
    pGVar1[rotatedCoord._4_4_ + 1] = fVar3;
    if (pVVar2 != (Vec2d *)0x0) {
      operator_delete(pVVar2);
    }
  }
  return pGVar1;
}

Assistant:

GLfloat* PrimitiveDisplayer::getRotatedVertices(GLfloat blockSize, float angle) {
    GLfloat* vertices = new GLfloat[8];
    
    for (int i=0; i < 8; i+=2) {
        Vec2d* rotatedCoord = verticesVec[i/2]->getRotation(Vec2d::ORIGIN, angle)->withScale(blockSize);
        
        vertices[i] = rotatedCoord->getX();
        vertices[i+1] = rotatedCoord->getY();
        
        delete rotatedCoord;
        rotatedCoord = nullptr;
    }
    
    return vertices;
}